

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux_test.cpp
# Opt level: O1

void __thiscall license::test::read_disk_id::test_method(read_disk_id *this)

{
  uchar uVar1;
  pointer paVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  LCC_API_VIRTUALIZATION_SUMMARY LVar6;
  ulong uVar7;
  pointer __src;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  FUNCTION_RETURN result;
  undefined **local_830;
  ulong local_828;
  shared_count sStack_820;
  undefined4 **local_818;
  uint local_810;
  undefined4 local_80c;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  undefined4 *local_7d8;
  FUNCTION_RETURN *local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  shared_count sStack_7b8;
  undefined **local_7b0;
  ulong local_7a8;
  shared_count sStack_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  ExecutionEnvironment exec_env;
  anon_struct_1296_7_5326303c disk_info;
  
  os::ExecutionEnvironment::ExecutionEnvironment(&exec_env);
  LVar6 = os::ExecutionEnvironment::virtualization(&exec_env);
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  result = getDiskInfos(&disk_infos);
  if ((LVar6 & ~VM) == NONE) {
    local_630 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_628 = "";
    local_640 = &boost::unit_test::basic_cstring<char_const>::null;
    local_638 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_630,0x1b);
    local_7a8 = local_7a8 & 0xffffffffffffff00;
    local_7b0 = &PTR__lazy_ostream_001c8328;
    sStack_7a0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_798 = "";
    local_7d8 = &local_80c;
    local_80c = 0;
    local_7d0 = &result;
    local_7c8 = result == FUNC_RET_OK;
    local_7c0 = 0;
    sStack_7b8.pi_ = (sp_counted_base *)0x0;
    local_760 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_758 = "";
    disk_info.device._20_8_ = &local_7d0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c83a0;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    local_818 = &local_7d8;
    local_828 = local_828 & 0xffffffffffffff00;
    local_830 = &PTR__lazy_ostream_001c83a0;
    sStack_820.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7b8);
    local_650 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_648 = "";
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    local_658 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_650,0x1c);
    local_830 = (undefined **)
                CONCAT71(local_830._1_7_,
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish !=
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_828 = 0;
    sStack_820.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c83e0;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_9631;
    local_670 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_668 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_820);
    paVar2 = disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
        super__Vector_impl_data._M_start ==
        disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = 0;
      bVar10 = 0;
      bVar9 = 0;
    }
    else {
      bVar9 = 0;
      bVar10 = 0;
      uVar7 = 0;
      __src = disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
      do {
        memcpy(&disk_info,__src,0x510);
        bVar5 = disk_info.preferred;
        bVar4 = disk_info.label_initialized;
        bVar3 = disk_info.sn_initialized;
        if ((disk_info.sn_initialized & 1U) != 0) {
          local_810 = (uint)uVar7;
          uVar7 = 0;
          do {
            uVar1 = disk_info.disk_sn[uVar7];
            if (6 < uVar7) break;
            uVar7 = uVar7 + 1;
          } while (uVar1 == '\0');
          local_770 = 
          "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
          ;
          local_768 = "";
          local_780 = &boost::unit_test::basic_cstring<char_const>::null;
          local_778 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_770,0x2b,
                     &local_780);
          local_7b0 = (undefined **)CONCAT71(local_7b0._1_7_,uVar1 != '\0');
          local_7a8 = 0;
          sStack_7a0.pi_ = (sp_counted_base *)0x0;
          local_828 = local_828 & 0xffffffffffffff00;
          local_830 = &PTR__lazy_ostream_001c8420;
          sStack_820.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_818 = (undefined4 **)0x19d0dd;
          local_790 = 
          "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
          ;
          local_788 = "";
          boost::test_tools::tt_detail::report_assertion
                    (&local_7b0,&local_830,&local_790,0x2b,1,1,0);
          boost::detail::shared_count::~shared_count(&sStack_7a0);
          uVar7 = (ulong)local_810;
        }
        bVar10 = bVar10 | bVar3;
        bVar8 = (byte)uVar7 | bVar5;
        uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar8);
        bVar9 = bVar9 | bVar4;
        __src = __src + 1;
      } while (__src != paVar2);
      bVar10 = bVar10 & 1;
      bVar9 = bVar9 & 1;
      bVar8 = bVar8 & 1;
    }
    local_680 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_678 = "";
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_680,0x2e);
    local_828 = 0;
    sStack_820.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8460;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_9663;
    local_6a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_698 = "";
    local_830._0_1_ = bVar10;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_820);
    local_6b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6a8 = "";
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6b0,0x2f);
    local_828 = 0;
    sStack_820.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c84a0;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_967c;
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6c8 = "";
    local_830._0_1_ = bVar9;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_820);
    local_6e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6d8 = "";
    local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6e0,0x30);
    local_830 = (undefined **)CONCAT71(local_830._1_7_,bVar8);
    local_828 = 0;
    sStack_820.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c84e0;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_9695;
    local_700 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6f8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    if (LVar6 != CONTAINER) goto LAB_0011ca87;
    local_710 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_708 = "";
    local_720 = &boost::unit_test::basic_cstring<char_const>::null;
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_710,0x33);
    local_7a8 = local_7a8 & 0xffffffffffffff00;
    local_7b0 = &PTR__lazy_ostream_001c8328;
    sStack_7a0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_798 = "";
    local_7d8 = &local_80c;
    local_80c = 1;
    local_7d0 = &result;
    local_7c8 = result == FUNC_RET_NOT_AVAIL;
    local_7c0 = 0;
    sStack_7b8.pi_ = (sp_counted_base *)0x0;
    local_760 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_758 = "";
    disk_info.device._20_8_ = &local_7d0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c83a0;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    local_818 = &local_7d8;
    local_828 = local_828 & 0xffffffffffffff00;
    local_830 = &PTR__lazy_ostream_001c83a0;
    sStack_820.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7b8);
    local_730 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_728 = "";
    local_740 = &boost::unit_test::basic_cstring<char_const>::null;
    local_738 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_730,0x34);
    local_830 = (undefined **)
                CONCAT71(local_830._1_7_,
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish ==
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_828 = 0;
    sStack_820.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8520;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_96c7;
    local_750 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_748 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_820);
LAB_0011ca87:
  if (disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  os::DmiInfo::~DmiInfo(&exec_env.m_dmi_info);
  os::CpuInfo::~CpuInfo(&exec_env.m_cpu_info);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(read_disk_id) {
	os::ExecutionEnvironment exec_env;
	LCC_API_VIRTUALIZATION_SUMMARY virt = exec_env.virtualization();
	vector<DiskInfo> disk_infos;
	FUNCTION_RETURN result = getDiskInfos(disk_infos);
	if (virt == LCC_API_VIRTUALIZATION_SUMMARY::NONE || virt == LCC_API_VIRTUALIZATION_SUMMARY::VM) {
		BOOST_CHECK_EQUAL(result, FUNC_RET_OK);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() > 0, "Found some disk");
		bool preferred_found = false;
		bool uuid_found = false;
		bool label_found = false;

		for (auto disk_info : disk_infos) {
			uuid_found = uuid_found || disk_info.sn_initialized;
			preferred_found = preferred_found || disk_info.preferred;
			label_found = label_found || disk_info.label_initialized;

			if (disk_info.sn_initialized) {
				bool all_zero = true;
				for (int i = 0; i < sizeof(disk_info.disk_sn) && all_zero; i++) {
					all_zero = (disk_info.disk_sn[i] == 0);
				}
				BOOST_CHECK_MESSAGE(!all_zero, "disksn is not all zero");
			}
		}
		BOOST_CHECK_MESSAGE(uuid_found, "At least one UUID initialized");
		BOOST_CHECK_MESSAGE(label_found, "At least one label found");
		BOOST_CHECK_MESSAGE(preferred_found, "At least one standard mounted file system");
	} else if (virt == LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER) {
		// in docker or lxc diskInfo is very likely not to find any good disk.
		BOOST_CHECK_EQUAL(result, FUNC_RET_NOT_AVAIL);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() == 0, "Found no disk");
	}
}